

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-output.c
# Opt level: O1

_Bool change_panel(wchar_t dir)

{
  term_conflict *t;
  _Bool _Var1;
  wchar_t wVar2;
  wchar_t wVar3;
  _Bool _Var4;
  _Bool _Var5;
  long lVar6;
  
  lVar6 = 0;
  _Var4 = false;
  _Var5 = false;
  do {
    t = (term_conflict *)angband_term[lVar6];
    if (t != (term_conflict *)0x0) {
      if (lVar6 == 0) {
LAB_001e447c:
        wVar2 = Term->hgt - (row_top_map[Term->sidebar_mode] + row_bottom_map[Term->sidebar_mode]);
      }
      else {
        if ((window_flag[lVar6] & 0x80) == 0) goto LAB_001e451d;
        if (lVar6 == 0) goto LAB_001e447c;
        wVar2 = t->hgt;
      }
      if (lVar6 == 0) {
        wVar3 = ~col_map[Term->sidebar_mode] + Term->wid;
      }
      else {
        wVar3 = t->wid;
      }
      _Var1 = modify_panel(t,((wVar2 / (int)(uint)tile_height) * (int)ddy[dir]) / 2 + t->offset_y,
                           ((int)ddx[dir] * (wVar3 / (int)(uint)tile_width)) / 2 + t->offset_x);
      _Var5 = _Var4;
      if (_Var1) {
        _Var4 = true;
        _Var5 = true;
      }
    }
LAB_001e451d:
    lVar6 = lVar6 + 1;
    if (lVar6 == 8) {
      return _Var5;
    }
  } while( true );
}

Assistant:

bool change_panel(int dir)
{
	bool changed = false;
	int j;

	/* Scan windows */
	for (j = 0; j < ANGBAND_TERM_MAX; j++) {
		int screen_hgt, screen_wid;
		int wx, wy;

		term *t = angband_term[j];

		/* No window */
		if (!t) continue;

		/* No relevant flags */
		if ((j > 0) && !(window_flag[j] & PW_OVERHEAD)) continue;

		screen_hgt = (j == 0) ? SCREEN_HGT : t->hgt / tile_height;
		screen_wid = (j == 0) ? SCREEN_WID : t->wid / tile_width;

		/* Shift by half a panel */
		wy = t->offset_y + ddy[dir] * screen_hgt / 2;
		wx = t->offset_x + ddx[dir] * screen_wid / 2;

		/* Use "modify_panel" */
		if (modify_panel(t, wy, wx)) changed = true;
	}

	return (changed);
}